

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

void __thiscall smf::MidiFile::splitTracksByChannel(MidiFile *this)

{
  int iVar1;
  MidiEventList *this_00;
  int iVar2;
  MidiEvent *pMVar3;
  MidiEventList *pMVar4;
  long lVar5;
  int iVar6;
  size_type sVar7;
  uint uVar8;
  size_type __new_size;
  
  joinTracks(this);
  if (this->m_theTrackState != 0) {
    iVar1 = this->m_theTimeState;
    if (iVar1 == 0) {
      makeAbsoluteTicks(this);
    }
    this_00 = *(this->m_events).
               super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    iVar2 = MidiEventList::size(this_00);
    if (iVar2 < 1) {
      __new_size = 2;
    }
    else {
      uVar8 = 0;
      iVar6 = 0;
      do {
        pMVar3 = MidiEventList::operator[](this_00,iVar6);
        if ((pMVar3->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (pMVar3->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start) {
          pMVar3 = MidiEventList::operator[](this_00,iVar6);
          if (*(pMVar3->super_MidiMessage).
               super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start < 0xf0) {
            pMVar3 = MidiEventList::operator[](this_00,iVar6);
            if (uVar8 < (*(pMVar3->super_MidiMessage).
                          super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start & 0xf)) {
              pMVar3 = MidiEventList::operator[](this_00,iVar6);
              uVar8 = *(pMVar3->super_MidiMessage).
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start & 0xf;
            }
          }
        }
        iVar6 = iVar6 + 1;
      } while (iVar2 != iVar6);
      __new_size = (size_type)(uVar8 + 2);
    }
    *(this->m_events).
     super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
     super__Vector_impl_data._M_start = (MidiEventList *)0x0;
    std::vector<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>::resize
              (&this->m_events,__new_size);
    sVar7 = 0;
    do {
      pMVar4 = (MidiEventList *)operator_new(0x18);
      MidiEventList::MidiEventList(pMVar4);
      (this->m_events).
      super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>._M_impl.
      super__Vector_impl_data._M_start[sVar7] = pMVar4;
      sVar7 = sVar7 + 1;
    } while (__new_size != sVar7);
    if (0 < iVar2) {
      iVar6 = 0;
      do {
        pMVar3 = MidiEventList::operator[](this_00,iVar6);
        if (*(pMVar3->super_MidiMessage).super_vector<unsigned_char,_std::allocator<unsigned_char>_>
             .super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start < 0xf0) {
          pMVar3 = MidiEventList::operator[](this_00,iVar6);
          if ((pMVar3->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              (pMVar3->super_MidiMessage).
              super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) goto LAB_0011c4b9;
          pMVar3 = MidiEventList::operator[](this_00,iVar6);
          lVar5 = (ulong)(*(pMVar3->super_MidiMessage).
                           super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start & 0xf) + 1;
        }
        else {
LAB_0011c4b9:
          lVar5 = 0;
        }
        pMVar4 = (this->m_events).
                 super__Vector_base<smf::MidiEventList_*,_std::allocator<smf::MidiEventList_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar5];
        pMVar3 = MidiEventList::operator[](this_00,iVar6);
        MidiEventList::push_back_no_copy(pMVar4,pMVar3);
        iVar6 = iVar6 + 1;
      } while (iVar2 != iVar6);
    }
    MidiEventList::detach(this_00);
    MidiEventList::~MidiEventList(this_00);
    operator_delete(this_00);
    if (iVar1 == 0) {
      makeDeltaTicks(this);
    }
    this->m_theTrackState = 0;
  }
  return;
}

Assistant:

void MidiFile::splitTracksByChannel(void) {
	joinTracks();
	if (getTrackState() == TRACK_STATE_SPLIT) {
		return;
	}

	int oldTimeState = getTickState();
	if (oldTimeState == TIME_STATE_DELTA) {
		makeAbsoluteTicks();
	}

	int maxTrack = 0;
	int i;
	MidiEventList& eventlist = *m_events[0];
	MidiEventList* olddata = &eventlist;
	int length = eventlist.size();
	for (i=0; i<length; i++) {
		if (eventlist[i].size() == 0) {
			continue;
		}
		if ((eventlist[i][0] & 0xf0) == 0xf0) {
			// ignore system and meta messages.
			continue;
		}
		if (maxTrack < (eventlist[i][0] & 0x0f)) {
			maxTrack = eventlist[i][0] & 0x0f;
		}
	}
	int trackCount = maxTrack + 2; // + 1 for expression track

	if (trackCount <= 1) {
		// only one channel, so don't do anything (leave as Type-0 file).
		return;
	}

	m_events[0] = NULL;
	m_events.resize(trackCount);
	for (i=0; i<trackCount; i++) {
		m_events[i] = new MidiEventList;
	}

	for (i=0; i<length; i++) {
		int trackValue = 0;
		if ((eventlist[i][0] & 0xf0) == 0xf0) {
			trackValue = 0;
		} else if (eventlist[i].size() > 0) {
			trackValue = (eventlist[i][0] & 0x0f) + 1;
		}
		m_events[trackValue]->push_back_no_copy(&eventlist[i]);
	}

	olddata->detach();
	delete olddata;

	if (oldTimeState == TIME_STATE_DELTA) {
		makeDeltaTicks();
	}

	m_theTrackState = TRACK_STATE_SPLIT;
}